

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall phosg::Image::Image(Image *this,Image *im)

{
  ssize_t sVar1;
  size_t __size;
  void *__dest;
  
  sVar1 = im->height;
  this->width = im->width;
  this->height = sVar1;
  this->has_alpha = im->has_alpha;
  this->channel_width = im->channel_width;
  this->max_value = im->max_value;
  __size = get_data_size(this);
  __dest = malloc(__size);
  (this->data).raw = __dest;
  memcpy(__dest,(im->data).raw,__size);
  return;
}

Assistant:

Image::Image(const Image& im)
    : width(im.width),
      height(im.height),
      has_alpha(im.has_alpha),
      channel_width(im.channel_width),
      max_value(im.max_value) {
  size_t num_bytes = this->get_data_size();
  this->data.raw = malloc(num_bytes);
  memcpy(this->data.raw, im.data.raw, num_bytes * sizeof(uint8_t));
}